

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleParallelAnalyzerSettings.cpp
# Opt level: O3

void __thiscall
SimpleParallelAnalyzerSettings::UpdateInterfacesFromSettings(SimpleParallelAnalyzerSettings *this)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = (ulong)((long)(this->mDataChannels).super__Vector_base<Channel,_std::allocator<Channel>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->mDataChannels).super__Vector_base<Channel,_std::allocator<Channel>_>.
                       _M_impl.super__Vector_impl_data._M_start) >> 4;
  if ((int)uVar1 != 0) {
    uVar2 = 0;
    do {
      AnalyzerSettingInterfaceChannel::SetChannel
                ((Channel *)
                 (this->mDataChannelsInterface).
                 super__Vector_base<AnalyzerSettingInterfaceChannel_*,_std::allocator<AnalyzerSettingInterfaceChannel_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar2]);
      uVar2 = uVar2 + 1;
    } while ((uVar1 & 0xffffffff) != uVar2);
  }
  AnalyzerSettingInterfaceChannel::SetChannel
            ((Channel *)
             (this->mClockChannelInterface)._M_t.
             super___uniq_ptr_impl<AnalyzerSettingInterfaceChannel,_std::default_delete<AnalyzerSettingInterfaceChannel>_>
             ._M_t.
             super__Tuple_impl<0UL,_AnalyzerSettingInterfaceChannel_*,_std::default_delete<AnalyzerSettingInterfaceChannel>_>
             .super__Head_base<0UL,_AnalyzerSettingInterfaceChannel_*,_false>._M_head_impl);
  AnalyzerSettingInterfaceNumberList::SetNumber((double)(int)this->mClockEdge);
  return;
}

Assistant:

void SimpleParallelAnalyzerSettings::UpdateInterfacesFromSettings()
{
    U32 count = mDataChannels.size();
    for( U32 i = 0; i < count; i++ )
    {
        mDataChannelsInterface[ i ]->SetChannel( mDataChannels[ i ] );
    }

    mClockChannelInterface->SetChannel( mClockChannel );
    mClockEdgeInterface->SetNumber( static_cast<double>( mClockEdge ) );
}